

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGeneric<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::SuffixOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  bool *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
  UnifiedVectorFormat::UnifiedVectorFormat(&rdata);
  Vector::ToUnifiedFormat(left,count,&ldata);
  Vector::ToUnifiedFormat(right,count,&rdata);
  Vector::SetVectorType(result,FLAT_VECTOR);
  result_data = (bool *)result->data;
  FlatVector::VerifyFlatVector(result);
  ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::SuffixOperator,bool>
            ((string_t *)ldata.data,(string_t *)rdata.data,result_data,ldata.sel,rdata.sel,count,
             &ldata.validity,&rdata.validity,&result->validity,fun);
  UnifiedVectorFormat::~UnifiedVectorFormat(&rdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}